

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O0

void __thiscall QPainterPath::addEllipse(QPainterPath *this,QRectF *boundingRect)

{
  QRectF r;
  bool bVar1;
  QPainterPathPrivate *pQVar2;
  qsizetype qVar3;
  QRectF *in_RSI;
  long in_FS_OFFSET;
  bool first;
  QPointF start;
  int point_count;
  QPointF pts [12];
  QPainterPath *this_00;
  QPointF *e;
  QPointF *c2;
  QPointF *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  byte bVar4;
  qreal in_stack_fffffffffffffec8;
  QPointF *local_128;
  QPointF local_c8;
  int *in_stack_ffffffffffffff48;
  QPointF *in_stack_ffffffffffffff50;
  qreal in_stack_ffffffffffffff58;
  qreal in_stack_ffffffffffffff60;
  QRectF *in_stack_ffffffffffffff68;
  qreal local_8;
  
  local_8 = *(qreal *)(in_FS_OFFSET + 0x28);
  this_00 = (QPainterPath *)in_RSI->yp;
  e = (QPointF *)in_RSI->w;
  c2 = (QPointF *)in_RSI->h;
  r.yp = (qreal)in_stack_fffffffffffffeb8;
  r.xp = (qreal)c2;
  r.w._0_7_ = in_stack_fffffffffffffec0;
  r.w._7_1_ = in_stack_fffffffffffffec7;
  r.h = in_stack_fffffffffffffec8;
  bVar1 = hasValidCoords(r);
  if ((bVar1) && (bVar1 = QRectF::isNull(in_RSI), !bVar1)) {
    ensureData(this_00);
    detach(this_00);
    pQVar2 = d_func((QPainterPath *)0x5b7e1f);
    qVar3 = QList<QPainterPath::Element>::size(&pQVar2->elements);
    bVar4 = qVar3 < 2;
    memset(&local_c8,0xff,0xc0);
    local_128 = &local_c8;
    do {
      QPointF::QPointF(local_128);
      local_128 = local_128 + 1;
    } while (local_128 != (QPointF *)&stack0xfffffffffffffff8);
    qt_curves_for_arc(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                      in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    moveTo((QPainterPath *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
           in_stack_fffffffffffffeb8);
    cubicTo((QPainterPath *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
            in_stack_fffffffffffffeb8,c2,e);
    cubicTo((QPainterPath *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
            in_stack_fffffffffffffeb8,c2,e);
    cubicTo((QPainterPath *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
            in_stack_fffffffffffffeb8,c2,e);
    cubicTo((QPainterPath *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
            in_stack_fffffffffffffeb8,c2,e);
    pQVar2 = d_func((QPainterPath *)0x5b7fb9);
    pQVar2->field_0x84 = pQVar2->field_0x84 & 0xfe | 1;
    pQVar2 = d_func((QPainterPath *)0x5b7fdd);
    pQVar2->field_0x84 = pQVar2->field_0x84 & 0xef | (bVar4 & 1) << 4;
  }
  if (*(qreal *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPainterPath::addEllipse(const QRectF &boundingRect)
{
    if (!hasValidCoords(boundingRect)) {
#ifndef QT_NO_DEBUG
        qWarning("QPainterPath::addEllipse: Adding point with invalid coordinates, ignoring call");
#endif
        return;
    }

    if (boundingRect.isNull())
        return;

    ensureData();
    detach();

    bool first = d_func()->elements.size() < 2;

    QPointF pts[12];
    int point_count;
    QPointF start = qt_curves_for_arc(boundingRect, 0, -360, pts, &point_count);

    moveTo(start);
    cubicTo(pts[0], pts[1], pts[2]);           // 0 -> 270
    cubicTo(pts[3], pts[4], pts[5]);           // 270 -> 180
    cubicTo(pts[6], pts[7], pts[8]);           // 180 -> 90
    cubicTo(pts[9], pts[10], pts[11]);         // 90 - >0
    d_func()->require_moveTo = true;

    d_func()->convex = first;
}